

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_traits.h
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
lf::mesh::utils::MeshFunctionAT<double>::operator()
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          MeshFunctionAT<double> *this,Entity *e,MatrixXd *local)

{
  runtime_error *this_00;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [376];
  MatrixXd *local_28;
  MatrixXd *local_local;
  Entity *e_local;
  MeshFunctionAT<double> *this_local;
  
  local_28 = local;
  local_local = (MatrixXd *)e;
  e_local = (Entity *)this;
  this_local = (MeshFunctionAT<double> *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::operator<<(local_1a0,"Should never be called, this is an archetype");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"false",&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/mesh_function_traits.h"
             ,&local_209);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_1e0,&local_208,0xc0,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"this code should not be reached");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<R> operator()(const Entity& e,
                            const Eigen::MatrixXd& local) const {
    // NOLINTEND(misc-unused-parameters)
    LF_VERIFY_MSG(false, "Should never be called, this is an archetype");
    return {};
  }